

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O3

CBlockLocator * __thiscall
HeadersSyncState::NextHeadersRequestLocator
          (CBlockLocator *__return_storage_ptr__,HeadersSyncState *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  State SVar4;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> chain_start_locator;
  vector<uint256,_std::allocator<uint256>_> local_68;
  vector<uint256,_std::allocator<uint256>_> local_50;
  uint256 local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_download_state == FINAL) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_0086a8db:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    LocatorEntries(&local_50,this->m_chain_start);
    local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (uint256 *)0x0;
    local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    SVar4 = this->m_download_state;
    if (SVar4 == PRESYNC) {
      CBlockHeader::GetHash(&local_38,&this->m_last_header_received);
      if (local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *(undefined8 *)
         (((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             local_38.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         (((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             local_38.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)
         ((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems =
             local_38.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         (((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) =
             local_38.super_base_blob<256U>.m_data._M_elems._8_8_;
        local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      SVar4 = this->m_download_state;
    }
    if (SVar4 == REDOWNLOAD) {
      if (local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                  ((vector<uint256,std::allocator<uint256>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish,&this->m_redownload_buffer_last_hash);
      }
      else {
        uVar1 = *(undefined8 *)
                 (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems;
        uVar2 = *(undefined8 *)
                 ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8);
        uVar3 = *(undefined8 *)
                 ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18
                 );
        *(undefined8 *)
         (((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10);
        *(undefined8 *)
         (((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar3;
        *(undefined8 *)
         ((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar1;
        *(undefined8 *)
         (((local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) = uVar2;
        local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    std::vector<uint256,std::allocator<uint256>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<uint256*,std::vector<uint256,std::allocator<uint256>>>>
              ((vector<uint256,std::allocator<uint256>> *)&local_68,
               local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish,
               local_50.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_50.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish);
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (local_50.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0086a8db;
  }
  return __return_storage_ptr__;
}

Assistant:

CBlockLocator HeadersSyncState::NextHeadersRequestLocator() const
{
    Assume(m_download_state != State::FINAL);
    if (m_download_state == State::FINAL) return {};

    auto chain_start_locator = LocatorEntries(m_chain_start);
    std::vector<uint256> locator;

    if (m_download_state == State::PRESYNC) {
        // During pre-synchronization, we continue from the last header received.
        locator.push_back(m_last_header_received.GetHash());
    }

    if (m_download_state == State::REDOWNLOAD) {
        // During redownload, we will download from the last received header that we stored.
        locator.push_back(m_redownload_buffer_last_hash);
    }

    locator.insert(locator.end(), chain_start_locator.begin(), chain_start_locator.end());

    return CBlockLocator{std::move(locator)};
}